

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_34b9b7::NameTreeDetails::compareKeys
          (NameTreeDetails *this,QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  byte bVar1;
  logic_error *this_00;
  bool bVar2;
  uint local_e4;
  byte local_c1;
  undefined1 local_98 [8];
  string bs;
  string as;
  QPDFObjectHandle local_50 [2];
  QPDFObjectHandle local_30;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *b_local;
  QPDFObjectHandle *a_local;
  NameTreeDetails *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (QPDFObjectHandle *)this;
  QPDFObjectHandle::QPDFObjectHandle(&local_30,a);
  bVar1 = (**(code **)((long)*this + 8))(this,&local_30);
  bVar2 = (bVar1 & 1) != 0;
  local_c1 = 0;
  if (bVar2) {
    QPDFObjectHandle::QPDFObjectHandle(local_50,b);
    local_c1 = (**(code **)((long)*this + 8))(this,local_50);
  }
  if (bVar2) {
    QPDFObjectHandle::~QPDFObjectHandle(local_50);
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  if (((local_c1 ^ 0xff) & 1) == 0) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)((long)&bs.field_2 + 8),a);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)local_98,b);
    bVar2 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&bs.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
    if (bVar2) {
      local_e4 = 0xffffffff;
    }
    else {
      bVar2 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&bs.field_2 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98);
      local_e4 = (uint)bVar2;
    }
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)(bs.field_2._M_local_buf + 8));
    return local_e4;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"comparing invalid keys");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
        compareKeys(QPDFObjectHandle a, QPDFObjectHandle b) const override
        {
            if (!(keyValid(a) && keyValid(b))) {
                // We don't call this without calling keyValid first
                throw std::logic_error("comparing invalid keys");
            }
            auto as = a.getUTF8Value();
            auto bs = b.getUTF8Value();
            return ((as < bs) ? -1 : (as > bs) ? 1 : 0);
        }